

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *matrix)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  complex<double> *pcVar3;
  undefined8 uVar4;
  long lVar5;
  int64_t i;
  ulong uVar6;
  
  lVar5 = matrix->size_;
  this->size_ = lVar5;
  alloc_unique_array<std::complex<double>>((dense *)&this->data_,lVar5 * lVar5);
  pcVar3 = (matrix->data_)._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  lVar5 = 0;
  for (uVar6 = 0; uVar6 < (ulong)(this->size_ * this->size_); uVar6 = uVar6 + 1) {
    puVar1 = (undefined8 *)(pcVar3->_M_value + lVar5);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)((this->data_)._M_t.
                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                     .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value +
             lVar5);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    lVar5 = lVar5 + 0x10;
  }
  return;
}

Assistant:

SquareMatrix( const SquareMatrix< T >& matrix )
        : size_( matrix.size() )
        , data_( alloc_unique_array< T >( size_ * size_ ) )
        {
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
        }